

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O2

int idaNlsResidualSensSim(N_Vector ycorSim,N_Vector resSim,void *ida_mem)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (ida_mem == (void *)0x0) {
    iVar4 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x16d,"idaNlsResidualSensSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    uVar1 = **ycorSim->content;
    uVar2 = **resSim->content;
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x290),uVar1,
                 *(undefined8 *)((long)ida_mem + 0x280));
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x508),
                 *(undefined8 *)((long)ida_mem + 0x298),uVar1,*(undefined8 *)((long)ida_mem + 0x288)
                );
    iVar4 = (**(code **)((long)ida_mem + 0x730))
                      (*(undefined8 *)((long)ida_mem + 0x4f8),*(undefined8 *)((long)ida_mem + 0x280)
                       ,*(undefined8 *)((long)ida_mem + 0x288),uVar2,
                       *(undefined8 *)((long)ida_mem + 0x18));
    *(long *)((long)ida_mem + 0x5c0) = *(long *)((long)ida_mem + 0x5c0) + 1;
    N_VScale(0x3ff0000000000000,uVar2,*(undefined8 *)((long)ida_mem + 0x2b8));
    if (iVar4 < 0) {
      iVar4 = -8;
    }
    else if (iVar4 == 0) {
      lVar6 = *ycorSim->content + 8;
      lVar3 = *resSim->content;
      N_VLinearSumVectorArray
                (0x3ff0000000000000,0x3ff0000000000000,*(undefined4 *)((long)ida_mem + 0xa0),
                 *(undefined8 *)((long)ida_mem + 0x3a0),lVar6,*(undefined8 *)((long)ida_mem + 0x390)
                );
      N_VLinearSumVectorArray
                (0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x508),
                 *(undefined4 *)((long)ida_mem + 0xa0),*(undefined8 *)((long)ida_mem + 0x3a8),lVar6,
                 *(undefined8 *)((long)ida_mem + 0x398));
      iVar5 = (**(code **)((long)ida_mem + 0xa8))
                        (*(undefined8 *)((long)ida_mem + 0x4f8),
                         *(undefined4 *)((long)ida_mem + 0xa0),
                         *(undefined8 *)((long)ida_mem + 0x280),
                         *(undefined8 *)((long)ida_mem + 0x288),uVar2,
                         *(undefined8 *)((long)ida_mem + 0x390),
                         *(undefined8 *)((long)ida_mem + 0x398),lVar3 + 8,
                         *(undefined8 *)((long)ida_mem + 0xb0),
                         *(undefined8 *)((long)ida_mem + 0x3b8),
                         *(undefined8 *)((long)ida_mem + 0x3c0),
                         *(undefined8 *)((long)ida_mem + 0x3c8));
      *(long *)((long)ida_mem + 0x5d0) = *(long *)((long)ida_mem + 0x5d0) + 1;
      if (iVar5 < 0) {
        iVar4 = -0x29;
      }
      else {
        iVar4 = 0xb;
        if (iVar5 == 0) {
          iVar4 = 0;
        }
      }
    }
    else {
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int idaNlsResidualSensSim(N_Vector ycorSim, N_Vector resSim, void* ida_mem)
{
  IDAMem IDA_mem;
  int retval;
  N_Vector ycor, res;
  N_Vector *ycorS, *resS;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* extract state and residual vectors from the vector wrapper */
  ycor = NV_VEC_SW(ycorSim, 0);
  res  = NV_VEC_SW(resSim, 0);

  /* update yy and yp based on the current correction */
  N_VLinearSum(ONE, IDA_mem->ida_yypredict, ONE, ycor, IDA_mem->ida_yy);
  N_VLinearSum(ONE, IDA_mem->ida_yppredict, IDA_mem->ida_cj, ycor,
               IDA_mem->ida_yp);

  /* evaluate residual */
  retval = IDA_mem->nls_res(IDA_mem->ida_tn, IDA_mem->ida_yy, IDA_mem->ida_yp,
                            res, IDA_mem->ida_user_data);

  /* increment the number of residual evaluations */
  IDA_mem->ida_nre++;

  /* save a copy of the residual vector in savres */
  N_VScale(ONE, res, IDA_mem->ida_savres);

  if (retval < 0) { return (IDA_RES_FAIL); }
  if (retval > 0) { return (IDA_RES_RECVR); }

  /* extract sensitivity and residual vectors from the vector wrapper */
  ycorS = NV_VECS_SW(ycorSim) + 1;
  resS  = NV_VECS_SW(resSim) + 1;

  /* update yS and ypS based on the current correction */
  N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE, IDA_mem->ida_yySpredict, ONE,
                          ycorS, IDA_mem->ida_yyS);
  N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE, IDA_mem->ida_ypSpredict,
                          IDA_mem->ida_cj, ycorS, IDA_mem->ida_ypS);

  /* evaluate sens residual */
  retval = IDA_mem->ida_resS(IDA_mem->ida_Ns, IDA_mem->ida_tn, IDA_mem->ida_yy,
                             IDA_mem->ida_yp, res, IDA_mem->ida_yyS,
                             IDA_mem->ida_ypS, resS, IDA_mem->ida_user_dataS,
                             IDA_mem->ida_tmpS1, IDA_mem->ida_tmpS2,
                             IDA_mem->ida_tmpS3);

  /* increment the number of sens residual evaluations */
  IDA_mem->ida_nrSe++;

  if (retval < 0) { return (IDA_SRES_FAIL); }
  if (retval > 0) { return (IDA_SRES_RECVR); }

  return (IDA_SUCCESS);
}